

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O1

void __thiscall
deci_FlexLexer::deci_FlexLexer(deci_FlexLexer *this,istream *arg_yyin,ostream *arg_yyout)

{
  (this->super_FlexLexer)._vptr_FlexLexer = (_func_int **)&PTR__deci_FlexLexer_0011ecd8;
  if (arg_yyin == (istream *)0x0) {
    arg_yyin = (istream *)&std::cin;
  }
  std::istream::istream
            (&this->yyin,*(streambuf **)(arg_yyin + *(long *)(*(long *)arg_yyin + -0x18) + 0xe8));
  if (arg_yyout == (ostream *)0x0) {
    arg_yyout = (ostream *)&std::cout;
  }
  std::ostream::ostream
            (&this->yyout,*(streambuf **)(arg_yyout + *(long *)(*(long *)arg_yyout + -0x18) + 0xe8))
  ;
  *(undefined8 *)&(this->super_FlexLexer).yy_flex_debug = 0;
  this->yy_c_buf_p = (char *)0x0;
  this->yy_init = 0;
  this->yy_start = 0;
  (this->super_FlexLexer).yylineno = 1;
  this->yy_did_buffer_switch_on_eof = 0;
  this->yy_start_stack_depth = 0;
  this->yy_start_stack = (int *)0x0;
  this->yy_state_buf = (yy_state_type *)0x0;
  this->yy_buffer_stack_top = 0;
  this->yy_buffer_stack_max = 0;
  this->yy_buffer_stack = (yy_buffer_state **)0x0;
  this->yy_looking_for_trail_begin = 0;
  this->yy_more_flag = 0;
  this->yy_more_len = 0;
  this->yy_more_offset = 0;
  this->yy_prev_more_offset = 0;
  return;
}

Assistant:

yyFlexLexer::yyFlexLexer( std::istream* arg_yyin, std::ostream* arg_yyout ):
	yyin(arg_yyin ? arg_yyin->rdbuf() : std::cin.rdbuf()),
	yyout(arg_yyout ? arg_yyout->rdbuf() : std::cout.rdbuf())
{
	ctor_common();
}